

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O2

amqp_socket_t * amqp_ssl_socket_new(amqp_connection_state_t state)

{
  int iVar1;
  amqp_socket_t *socket;
  SSL_METHOD *meth;
  SSL_CTX *pSVar2;
  
  socket = (amqp_socket_t *)calloc(1,0x38);
  if (socket == (amqp_socket_t *)0x0) {
    return (amqp_socket_t *)0x0;
  }
  *(undefined4 *)&socket[2].klass = 0xffffffff;
  socket->klass = &amqp_ssl_socket_class;
  *(undefined4 *)&socket[6].klass = 1;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&openssl_init_mutex);
  if (iVar1 != 0) goto LAB_0010bdbb;
  if (do_initialize_openssl != 0) {
    if (amqp_openssl_lockarray == (pthread_mutex_t *)0x0) {
      amqp_openssl_lockarray = (pthread_mutex_t *)calloc(1,0x28);
      if (amqp_openssl_lockarray != (pthread_mutex_t *)0x0) {
        iVar1 = pthread_mutex_init((pthread_mutex_t *)amqp_openssl_lockarray,
                                   (pthread_mutexattr_t *)0x0);
        if (iVar1 == 0) goto LAB_0010bde3;
        free(amqp_openssl_lockarray);
        amqp_openssl_lockarray = (pthread_mutex_t *)0x0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&openssl_init_mutex);
      goto LAB_0010bdbb;
    }
LAB_0010bde3:
    if (openssl_initialized == '\0') {
      OPENSSL_config((char *)0x0);
      OPENSSL_init_ssl(0,0);
      OPENSSL_init_ssl(0x200002,0);
      openssl_initialized = '\x01';
    }
  }
  open_ssl_connections = open_ssl_connections + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&openssl_init_mutex);
  meth = (SSL_METHOD *)TLS_client_method();
  pSVar2 = SSL_CTX_new(meth);
  socket[1].klass = (amqp_socket_class_t *)pSVar2;
  if (pSVar2 != (SSL_CTX *)0x0) {
    amqp_set_socket(state,socket);
    return socket;
  }
LAB_0010bdbb:
  amqp_ssl_socket_delete(socket);
  return (amqp_socket_t *)0x0;
}

Assistant:

amqp_socket_t *
amqp_ssl_socket_new(amqp_connection_state_t state)
{
  struct amqp_ssl_socket_t *self = calloc(1, sizeof(*self));
  int status;
  if (!self) {
    return NULL;
  }

  self->sockfd = -1;
  self->klass = &amqp_ssl_socket_class;
  self->verify = 1;

  status = initialize_openssl();
  if (status) {
    goto error;
  }

  self->ctx = SSL_CTX_new(SSLv23_client_method());
  if (!self->ctx) {
    goto error;
  }

  amqp_set_socket(state, (amqp_socket_t *)self);

  return (amqp_socket_t *)self;
error:
  amqp_ssl_socket_delete((amqp_socket_t *)self);
  return NULL;
}